

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeAddWindow(ImGuiDockNode *node,ImGuiWindow *window,bool add_to_tab_bar)

{
  int *piVar1;
  int iVar2;
  ImGuiID IVar3;
  uint uVar4;
  ImGuiDockNode *node_00;
  ImGuiWindow **ppIVar5;
  ImGuiWindow *pIVar6;
  ImGuiTabBar *pIVar7;
  ImGuiWindow **__dest;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  
  node_00 = window->DockNode;
  if (node_00 != (ImGuiDockNode *)0x0) {
    if (node_00->ID == node->ID) {
      __assert_fail("window->DockNode->ID != node->ID",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                    ,0x3092,"void ImGui::DockNodeAddWindow(ImGuiDockNode *, ImGuiWindow *, bool)");
    }
    DockNodeRemoveWindow(node_00,window,0);
  }
  if ((window->DockNode != (ImGuiDockNode *)0x0) && (window->DockNodeAsHost != (ImGuiDockNode *)0x0)
     ) {
    __assert_fail("window->DockNode == __null || window->DockNodeAsHost == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                  ,0x3095,"void ImGui::DockNodeAddWindow(ImGuiDockNode *, ImGuiWindow *, bool)");
  }
  iVar10 = (node->Windows).Size;
  iVar2 = (node->Windows).Capacity;
  if (iVar10 == iVar2) {
    iVar10 = iVar10 + 1;
    if (iVar2 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar2 / 2 + iVar2;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar2 < iVar10) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar10 << 3,GImAllocatorUserData);
      ppIVar5 = (node->Windows).Data;
      if (ppIVar5 != (ImGuiWindow **)0x0) {
        memcpy(__dest,ppIVar5,(long)(node->Windows).Size << 3);
        ppIVar5 = (node->Windows).Data;
        if ((ppIVar5 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
      }
      (node->Windows).Data = __dest;
      (node->Windows).Capacity = iVar10;
    }
  }
  (node->Windows).Data[(node->Windows).Size] = window;
  iVar10 = (node->Windows).Size;
  (node->Windows).Size = iVar10 + 1;
  node->field_0xba = node->field_0xba | 2;
  window->DockNode = node;
  window->DockId = node->ID;
  window->field_0x482 = window->field_0x482 & 0xfa | 0 < iVar10;
  if (node->HostWindow == (ImGuiWindow *)0x0) {
    if (((node->Windows).Size == 2) && (pIVar6 = *(node->Windows).Data, pIVar6->WasActive == false))
    {
      pIVar6->Hidden = true;
      pIVar6->HiddenFramesCanSkipItems = 1;
    }
    if ((node->ParentNode == (ImGuiDockNode *)0x0) && ((node->LocalFlags & 0x400U) == 0)) {
      if ((*(ushort *)&node->field_0xb8 & 7) == 0) {
        *(ushort *)&node->field_0xb8 = *(ushort *)&node->field_0xb8 | 2;
      }
      if ((*(ushort *)&node->field_0xb8 & 0x38) == 0) {
        *(ushort *)&node->field_0xb8 = *(ushort *)&node->field_0xb8 | 0x10;
      }
      if ((*(ushort *)&node->field_0xb8 & 0x1c0) == 0) {
        *(ushort *)&node->field_0xb8 = *(ushort *)&node->field_0xb8 | 0x80;
      }
    }
  }
  if (add_to_tab_bar) {
    if (node->TabBar == (ImGuiTabBar *)0x0) {
      DockNodeAddTabBar(node);
      IVar3 = node->SelectedTabId;
      pIVar7 = node->TabBar;
      pIVar7->NextSelectedTabId = IVar3;
      pIVar7->SelectedTabId = IVar3;
      uVar4 = (node->Windows).Size;
      uVar8 = (ulong)uVar4;
      if (1 < (int)uVar4) {
        lVar11 = 0;
        do {
          if ((int)uVar8 <= lVar11) {
            __assert_fail("i < Size",
                          "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.h"
                          ,0x62f,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
          }
          TabBarAddTab(node->TabBar,0,(node->Windows).Data[lVar11]);
          lVar11 = lVar11 + 1;
          uVar8 = (ulong)(node->Windows).Size;
        } while (lVar11 < (long)(uVar8 - 1));
      }
    }
    TabBarAddTab(node->TabBar,0x200000,window);
  }
  DockNodeUpdateVisibleFlag(node);
  if (node->HostWindow == (ImGuiWindow *)0x0) {
    return;
  }
  UpdateWindowParentAndRootLinks(window,window->Flags | 0x1000000,node->HostWindow);
  return;
}

Assistant:

static void ImGui::DockNodeAddWindow(ImGuiDockNode* node, ImGuiWindow* window, bool add_to_tab_bar)
{
    ImGuiContext& g = *GImGui; (void)g;
    if (window->DockNode)
    {
        // Can overwrite an existing window->DockNode (e.g. pointing to a disabled DockSpace node)
        IM_ASSERT(window->DockNode->ID != node->ID);
        DockNodeRemoveWindow(window->DockNode, window, 0);
    }
    IM_ASSERT(window->DockNode == NULL || window->DockNodeAsHost == NULL);
    IMGUI_DEBUG_LOG_DOCKING("DockNodeAddWindow node 0x%08X window '%s'\n", node->ID, window->Name);

    node->Windows.push_back(window);
    node->WantHiddenTabBarUpdate = true;
    window->DockNode = node;
    window->DockId = node->ID;
    window->DockIsActive = (node->Windows.Size > 1);
    window->DockTabWantClose = false;

    // If more than 2 windows appeared on the same frame, we'll create a new hosting DockNode from the point of the second window submission.
    // Then we need to hide the first window (after its been output) otherwise it would be visible as a standalone window for one frame.
    if (node->HostWindow == NULL && node->Windows.Size == 2 && node->Windows[0]->WasActive == false)
    {
        node->Windows[0]->Hidden = true;
        node->Windows[0]->HiddenFramesCanSkipItems = 1;
    }

    // When reactivating a node with one or two loose window, the window pos/size/viewport are authoritative over the node storage.
    // In particular it is important we init the viewport from the first window so we don't create two viewports and drop one.
    if (node->HostWindow == NULL && node->IsFloatingNode())
    {
        if (node->AuthorityForPos == ImGuiDataAuthority_Auto)
            node->AuthorityForPos = ImGuiDataAuthority_Window;
        if (node->AuthorityForSize == ImGuiDataAuthority_Auto)
            node->AuthorityForSize = ImGuiDataAuthority_Window;
        if (node->AuthorityForViewport == ImGuiDataAuthority_Auto)
            node->AuthorityForViewport = ImGuiDataAuthority_Window;
    }

    // Add to tab bar if requested
    if (add_to_tab_bar)
    {
        if (node->TabBar == NULL)
        {
            DockNodeAddTabBar(node);
            node->TabBar->SelectedTabId = node->TabBar->NextSelectedTabId = node->SelectedTabId;

            // Add existing windows
            for (int n = 0; n < node->Windows.Size - 1; n++)
                TabBarAddTab(node->TabBar, ImGuiTabItemFlags_None, node->Windows[n]);
        }
        TabBarAddTab(node->TabBar, ImGuiTabItemFlags_Unsorted, window);
    }

    DockNodeUpdateVisibleFlag(node);

    // Update this without waiting for the next time we Begin() in the window, so our host window will have the proper title bar color on its first frame.
    if (node->HostWindow)
        UpdateWindowParentAndRootLinks(window, window->Flags | ImGuiWindowFlags_ChildWindow, node->HostWindow);
}